

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.hpp
# Opt level: O3

void __thiscall
pstore::command_line::
opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
::opt<char[5]>(opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
               *this,char (*mods) [5])

{
  option::option(&this->super_option);
  (this->super_option)._vptr_option = (_func_int **)&PTR__opt_001ac390;
  (this->value_)._M_dataplus._M_p = (pointer)&(this->value_).field_2;
  (this->value_)._M_string_length = 0;
  (this->value_).field_2._M_local_buf[0] = '\0';
  (this->parser_).super_parser_base.literals_.
  super__Vector_base<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->parser_).super_parser_base.literals_.
  super__Vector_base<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->parser_).super_parser_base.literals_.
  super__Vector_base<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->parser_).super_parser_base._vptr_parser_base = (_func_int **)&PTR__parser_001afd50;
  apply_to_option<pstore::command_line::opt<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>>&,char_const(&)[5]>
            (this,mods);
  return;
}

Assistant:

explicit opt (Mods const &... mods)
                    : option () {
                apply_to_option (*this, mods...);
            }